

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O1

int run_test_getaddrinfo_fail_sync(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_getaddrinfo_t *puVar3;
  undefined4 *puVar4;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long extraout_RDX_01;
  undefined8 unaff_RBX;
  size_t *psVar6;
  undefined8 *puVar7;
  int *piVar8;
  long lVar9;
  uv_getaddrinfo_t req;
  undefined1 auStack_160 [144];
  undefined8 uStack_d0;
  code *pcStack_c0;
  code *pcStack_b8;
  code *pcStack_b0;
  undefined1 auStack_a8 [144];
  undefined8 local_18;
  
  pcStack_b0 = (code *)0x15b73e;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x15b758;
  iVar1 = uv_getaddrinfo(uVar2,auStack_a8,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    pcStack_b0 = (code *)0x15b769;
    uv_freeaddrinfo(local_18);
    pcStack_b0 = (code *)0x15b76e;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x15b782;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_b0 = (code *)0x15b78c;
    uv_run(unaff_RBX,0);
    pcStack_b0 = (code *)0x15b791;
    uVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x15b799;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  pcStack_b0 = run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  pcStack_b8 = (code *)0x15b7bd;
  pcStack_b0 = (code *)unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  pcStack_b8 = (code *)0x15b7c9;
  puVar3 = (uv_getaddrinfo_t *)uv_default_loop();
  pcStack_b8 = (code *)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar3,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    pcStack_b8 = (code *)0x15b7f5;
    puVar3 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_b8 = (code *)0x15b7ff;
    uv_run(puVar3,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    pcStack_b8 = (code *)0x15b80d;
    unaff_RBX = uv_default_loop();
    pcStack_b8 = (code *)0x15b821;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_b8 = (code *)0x15b82b;
    uv_run(unaff_RBX,0);
    pcStack_b8 = (code *)0x15b830;
    puVar3 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_b8 = (code *)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b8 = (code *)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    pcStack_b8 = (code *)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  pcStack_b8 = getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  pcStack_b8 = (code *)unaff_RBX;
  if (getaddrinfo_handle == puVar3) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    pcStack_c0 = (code *)0x15b867;
    free(puVar3);
    iVar1 = uv_freeaddrinfo(extraout_RDX);
    return iVar1;
  }
  pcStack_c0 = run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  pcStack_c0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,auStack_160,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_d0);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar3 = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar7 = (undefined8 *)0x4;
    puVar4 = (undefined4 *)malloc(4);
    if (puVar4 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar4 = (int)lVar9;
    puVar3->data = puVar4;
    puVar7 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar7,puVar3,getaddrinfo_cuncurrent_cb,"localhost",0,0,unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar9 = lVar9 + 1;
    puVar3 = puVar3 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar7 = (undefined8 *)uv_default_loop();
  lVar9 = 0;
  uv_run(puVar7,0);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_0015b9e9;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  puVar7 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar8 = (int *)*puVar7;
  piVar5 = callback_counts;
  psVar6 = &closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    psVar6 = psVar6 + 0x14;
    if (psVar6 == puVar7) goto LAB_0015ba2b;
    piVar5 = piVar5 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_01;
LAB_0015ba2b:
  if (*piVar8 == (int)lVar9) {
    *piVar5 = *piVar5 + 1;
    free(piVar8);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar8,0);
  return iVar1;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

TEST_IMPL(getaddrinfo_fail_sync) {
  uv_getaddrinfo_t req;

  /* Use a FQDN by ending in a period */
  ASSERT(0 > uv_getaddrinfo(uv_default_loop(),
                            &req,
                            NULL,
                            "xyzzy.xyzzy.xyzzy.",
                            NULL,
                            NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}